

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_frameProgression *
ZSTD_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTD_CCtx *cctx)

{
  long local_28;
  size_t buffered;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->inBuff == (char *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = cctx->inBuffPos - cctx->inToCompress;
  }
  __return_storage_ptr__->ingested = cctx->consumedSrcSize + local_28;
  __return_storage_ptr__->consumed = cctx->consumedSrcSize;
  __return_storage_ptr__->produced = cctx->producedCSize;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_getFrameProgression(cctx->mtctx);
    }
#endif
    {   ZSTD_frameProgression fp;
        size_t const buffered = (cctx->inBuff == NULL) ? 0 :
                                cctx->inBuffPos - cctx->inToCompress;
        if (buffered) assert(cctx->inBuffPos >= cctx->inToCompress);
        assert(buffered <= ZSTD_BLOCKSIZE_MAX);
        fp.ingested = cctx->consumedSrcSize + buffered;
        fp.consumed = cctx->consumedSrcSize;
        fp.produced = cctx->producedCSize;
        return fp;
}   }